

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O3

int Abc_SclHasBufferFanout(Abc_Obj_t *pObj)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(pObj->vFanouts).nSize;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      pvVar1 = pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar3]];
      if (((*(uint *)((long)pvVar1 + 0x14) & 0xf) == 7) && (*(int *)((long)pvVar1 + 0x1c) == 1)) {
        return 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  return 0;
}

Assistant:

int Abc_SclHasBufferFanout( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( Abc_ObjIsBuffer(pFanout) )
            return 1;
    return 0;
}